

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMan.c
# Opt level: O2

void Cov_ManFree(Cov_Man_t *p)

{
  Vec_Int_t *p_00;
  Vec_Ptr_t *__ptr;
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < p->vObjStrs->nSize; lVar1 = lVar1 + 1) {
    p_00 = *(Vec_Int_t **)((long)p->vObjStrs->pArray[lVar1] + 0x18);
    if (p_00 != (Vec_Int_t *)0x0) {
      Vec_IntFree(p_00);
    }
  }
  Min_ManFree(p->pManMin);
  __ptr = p->vObjStrs;
  free(__ptr->pArray);
  free(__ptr);
  Vec_IntFree(p->vFanCounts);
  Vec_IntFree(p->vTriv0);
  Vec_IntFree(p->vTriv1);
  Vec_IntFree(p->vComTo0);
  Vec_IntFree(p->vComTo1);
  Vec_IntFree(p->vPairs0);
  Vec_IntFree(p->vPairs1);
  free(p->pMemory);
  free(p);
  return;
}

Assistant:

void Cov_ManFree( Cov_Man_t * p )
{
    Vec_Int_t * vSupp;
    int i;
    for ( i = 0; i < p->vObjStrs->nSize; i++ )
    {
        vSupp = ((Cov_Obj_t *)p->vObjStrs->pArray[i])->vSupp;
        if ( vSupp ) Vec_IntFree( vSupp );
    }

    Min_ManFree( p->pManMin );
    Vec_PtrFree( p->vObjStrs );
    Vec_IntFree( p->vFanCounts );
    Vec_IntFree( p->vTriv0 );
    Vec_IntFree( p->vTriv1 );
    Vec_IntFree( p->vComTo0 );
    Vec_IntFree( p->vComTo1 );
    Vec_IntFree( p->vPairs0 );
    Vec_IntFree( p->vPairs1 );
    ABC_FREE( p->pMemory );
    ABC_FREE( p );
}